

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_1c2549::readFirstPart(string *fn)

{
  int pixelType;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint *puVar12;
  long lVar13;
  undefined1 in_R10B;
  long lVar14;
  DeepScanLineInputFile part_1;
  Box2i b2;
  Array2D<unsigned_int> sampleCount;
  InputFile part;
  Array2D<half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  DeepScanLineInputFile local_1e0;
  int local_1d0;
  int local_1cc;
  DeepTiledInputFile local_1c8;
  Array2D<unsigned_int> local_1b8;
  int local_198;
  int local_194;
  Slice local_190;
  Array2D<half_*> local_158;
  Array2D<float_*> local_138;
  Array2D<unsigned_int_*> local_118;
  Array2D<half> local_f8;
  Array2D<float> local_d8;
  Array2D<unsigned_int> local_b8;
  DeepFrameBuffer local_98;
  
  local_b8._sizeX = 0;
  local_b8._sizeY = 0;
  local_b8._data = (uint *)0x0;
  local_d8._data = (float *)0x0;
  local_d8._sizeX = 0;
  local_d8._sizeY = 0;
  local_f8._data = (half *)0x0;
  local_f8._sizeX = 0;
  local_f8._sizeY = 0;
  local_118._data = (uint **)0x0;
  local_118._sizeX = 0;
  local_118._sizeY = 0;
  local_138._data = (float **)0x0;
  local_138._sizeX = 0;
  local_138._sizeY = 0;
  local_158._data = (half **)0x0;
  local_158._sizeX = 0;
  local_158._sizeY = 0;
  local_1b8._data = (uint *)0x0;
  local_1b8._sizeX = 0;
  local_1b8._sizeY = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading first part ",0x13);
  std::ostream::flush();
  if (*(anonymous_namespace)::partTypes < 4) {
    pixelType = *(anonymous_namespace)::pixelTypes;
    iVar7 = *(anonymous_namespace)::levelModes;
    switch(*(anonymous_namespace)::partTypes) {
    case 0:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile((InputFile *)&local_190,pcVar1,iVar7);
      iVar4 = random_int(0x10b);
      iVar3 = random_int(0x10b);
      iVar7 = iVar3;
      if (iVar4 < iVar3) {
        iVar7 = iVar4;
      }
      if (iVar3 < iVar4) {
        iVar3 = iVar4;
      }
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer((FrameBuffer *)&local_98,pixelType,&local_b8,&local_d8,&local_f8,0xc1,
                          0x10b);
      Imf_2_5::InputFile::setFrameBuffer((InputFile *)&local_190,(FrameBuffer *)&local_98);
      Imf_2_5::InputFile::readPixels((InputFile *)&local_190,iVar7,iVar3);
      if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>(&local_b8,0,0xc0,iVar7,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3a3,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&local_d8,0,0xc0,iVar7,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(fData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3a6,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 2) {
        bVar2 = checkPixels<half>(&local_f8,0,0xc0,iVar7,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(hData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3a9,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&local_98);
      Imf_2_5::InputFile::~InputFile((InputFile *)&local_190);
      break;
    case 1:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledInputFile::TiledInputFile((TiledInputFile *)&local_190,pcVar1,iVar3);
      iVar3 = Imf_2_5::TiledInputFile::numXLevels((TiledInputFile *)&local_190);
      iVar4 = Imf_2_5::TiledInputFile::numYLevels((TiledInputFile *)&local_190);
      iVar5 = random_int(iVar3);
      iVar3 = random_int(iVar4);
      if (iVar7 == 1) {
        iVar3 = iVar5;
      }
      iVar7 = Imf_2_5::TiledInputFile::levelWidth((TiledInputFile *)&local_190,iVar5);
      local_1d0 = Imf_2_5::TiledInputFile::levelHeight((TiledInputFile *)&local_190,iVar3);
      local_1cc = iVar7;
      iVar7 = Imf_2_5::TiledInputFile::numXTiles((TiledInputFile *)&local_190,iVar5);
      iVar6 = Imf_2_5::TiledInputFile::numYTiles((TiledInputFile *)&local_190,iVar3);
      iVar9 = random_int(iVar7);
      iVar4 = random_int(iVar7);
      iVar10 = random_int(iVar6);
      iVar6 = random_int(iVar6);
      iVar8 = local_1cc;
      iVar7 = iVar4;
      if (iVar9 < iVar4) {
        iVar7 = iVar9;
      }
      if (iVar4 < iVar9) {
        iVar4 = iVar9;
      }
      iVar9 = iVar6;
      if (iVar10 < iVar6) {
        iVar9 = iVar10;
      }
      if (iVar6 < iVar10) {
        iVar6 = iVar10;
      }
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setInputFrameBuffer((FrameBuffer *)&local_98,pixelType,&local_b8,&local_d8,&local_f8,local_1cc
                          ,local_1d0);
      Imf_2_5::TiledInputFile::setFrameBuffer((TiledInputFile *)&local_190,(FrameBuffer *)&local_98)
      ;
      Imf_2_5::TiledInputFile::readTiles
                ((TiledInputFile *)&local_190,iVar7,iVar4,iVar9,iVar6,iVar5,iVar3);
      Imf_2_5::TiledInputFile::dataWindowForTile
                ((TiledInputFile *)&local_1e0,(int)&local_190,iVar7,iVar9,iVar5);
      Imf_2_5::TiledInputFile::dataWindowForTile
                ((TiledInputFile *)&local_1c8,(int)&local_190,iVar4,iVar6,iVar5);
      if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>
                          (&local_b8,(int)local_1e0.super_GenericInputFile._vptr_GenericInputFile,
                           (int)local_1c8._data,
                           local_1e0.super_GenericInputFile._vptr_GenericInputFile._4_4_,
                           local_1c8._data._4_4_,iVar8);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3d8,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&local_d8,
                                   (int)local_1e0.super_GenericInputFile._vptr_GenericInputFile,
                                   (int)local_1c8._data,
                                   local_1e0.super_GenericInputFile._vptr_GenericInputFile._4_4_,
                                   local_1c8._data._4_4_,iVar8);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3dc,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 2) {
        bVar2 = checkPixels<half>(&local_f8,
                                  (int)local_1e0.super_GenericInputFile._vptr_GenericInputFile,
                                  (int)local_1c8._data,
                                  local_1e0.super_GenericInputFile._vptr_GenericInputFile._4_4_,
                                  local_1c8._data._4_4_,iVar8);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x3e0,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&local_98);
      Imf_2_5::TiledInputFile::~TiledInputFile((TiledInputFile *)&local_190);
      break;
    case 2:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile(&local_1e0,pcVar1,iVar7);
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                (&local_98._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
                 SUB81(local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      puVar12 = (uint *)operator_new__(0x3252c);
      if (local_1b8._data != (uint *)0x0) {
        operator_delete__(local_1b8._data);
      }
      local_1b8._sizeX = 0x10b;
      local_1b8._sizeY = 0xc1;
      local_1b8._data = puVar12;
      Imf_2_5::Slice::Slice(&local_190,UINT,(char *)puVar12,4,0x304,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&local_98,&local_190);
      setInputDeepFrameBuffer(&local_98,pixelType,&local_118,&local_138,&local_158,0xc1,0x10b);
      Imf_2_5::DeepScanLineInputFile::setFrameBuffer(&local_1e0,&local_98);
      iVar4 = random_int(0x10b);
      iVar3 = random_int(0x10b);
      iVar7 = iVar3;
      if (iVar4 < iVar3) {
        iVar7 = iVar4;
      }
      if (iVar3 < iVar4) {
        iVar3 = iVar4;
      }
      Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&local_1e0,iVar7,iVar3);
      bVar2 = checkSampleCount(&local_1b8,0,0xc0,iVar7,iVar3,0xc1);
      if (!bVar2) {
        __assert_fail("checkSampleCount(sampleCount, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x3fd,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      allocatePixels(pixelType,&local_1b8,&local_118,&local_138,&local_158,0,0xc0,iVar7,iVar3);
      Imf_2_5::DeepScanLineInputFile::readPixels(&local_1e0,iVar7,iVar3);
      if (pixelType == 2) {
        bVar2 = checkPixels<half>(&local_1b8,&local_158,0,0xc0,iVar7,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x40d,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&local_1b8,&local_138,0,0xc0,iVar7,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x40a,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>(&local_1b8,&local_118,0,0xc0,iVar7,iVar3,0xc1);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x407,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      releasePixels(pixelType,&local_118,&local_138,&local_158,0,0xc0,iVar7,iVar3);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                   *)&local_98);
      Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(&local_1e0);
      break;
    case 3:
      pcVar1 = (fn->_M_dataplus)._M_p;
      iVar3 = Imf_2_5::globalThreadCount();
      Imf_2_5::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)&local_1e0,pcVar1,iVar3)
      ;
      iVar3 = Imf_2_5::DeepTiledInputFile::numXLevels((DeepTiledInputFile *)&local_1e0);
      iVar4 = Imf_2_5::DeepTiledInputFile::numYLevels((DeepTiledInputFile *)&local_1e0);
      iVar5 = random_int(iVar3);
      iVar3 = random_int(iVar4);
      if (iVar7 == 1) {
        iVar3 = iVar5;
      }
      iVar6 = Imf_2_5::DeepTiledInputFile::levelWidth((DeepTiledInputFile *)&local_1e0,iVar5);
      local_194 = Imf_2_5::DeepTiledInputFile::levelHeight((DeepTiledInputFile *)&local_1e0,iVar3);
      local_198 = iVar5;
      iVar7 = Imf_2_5::DeepTiledInputFile::numXTiles((DeepTiledInputFile *)&local_1e0,iVar5);
      iVar4 = Imf_2_5::DeepTiledInputFile::numYTiles((DeepTiledInputFile *)&local_1e0,iVar3);
      iVar5 = random_int(iVar7);
      iVar7 = random_int(iVar7);
      iVar8 = random_int(iVar4);
      iVar4 = random_int(iVar4);
      local_1cc = iVar7;
      if (iVar5 < iVar7) {
        local_1cc = iVar5;
      }
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      local_1d0 = iVar4;
      if (iVar8 < iVar4) {
        local_1d0 = iVar8;
      }
      if (iVar4 < iVar8) {
        iVar4 = iVar8;
      }
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._map._M_t._M_impl.super__Rb_tree_header._M_header;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                (&local_98._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
                 SUB81(local_98._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
      lVar13 = (long)local_194;
      lVar14 = (long)iVar6;
      uVar11 = lVar13 * lVar14;
      puVar12 = (uint *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 * 4);
      if (local_1b8._data != (uint *)0x0) {
        operator_delete__(local_1b8._data);
      }
      local_1b8._sizeX = lVar13;
      local_1b8._sizeY = lVar14;
      local_1b8._data = puVar12;
      Imf_2_5::Slice::Slice
                (&local_190,UINT,(char *)puVar12,4,lVar14 << 2,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&local_98,&local_190);
      setInputDeepFrameBuffer(&local_98,pixelType,&local_118,&local_138,&local_158,iVar6,local_194);
      Imf_2_5::DeepTiledInputFile::setFrameBuffer((DeepTiledInputFile *)&local_1e0,&local_98);
      Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
                ((DeepTiledInputFile *)&local_1e0,local_1cc,iVar7,local_1d0,iVar4,local_198,iVar3);
      iVar5 = local_198;
      Imf_2_5::DeepTiledInputFile::dataWindowForTile
                ((DeepTiledInputFile *)&local_190,(int)&local_1e0,local_1cc,local_1d0,local_198);
      Imf_2_5::DeepTiledInputFile::dataWindowForTile(&local_1c8,(int)&local_1e0,iVar7,iVar4,iVar5);
      bVar2 = checkSampleCount(&local_1b8,local_190.type,(int)local_1c8._data,local_190._4_4_,
                               local_1c8._data._4_4_,iVar6);
      if (!bVar2) {
        __assert_fail("checkSampleCount(sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                      ,0x43e,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
      allocatePixels(pixelType,&local_1b8,&local_118,&local_138,&local_158,local_190.type,
                     (int)local_1c8._data,local_190._4_4_,local_1c8._data._4_4_);
      Imf_2_5::DeepTiledInputFile::readTiles
                ((DeepTiledInputFile *)&local_1e0,local_1cc,iVar7,local_1d0,iVar4,iVar5,iVar3);
      if (pixelType == 2) {
        bVar2 = checkPixels<half>(&local_1b8,&local_158,local_190.type,(int)local_1c8._data,
                                  local_190._4_4_,local_1c8._data._4_4_,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<half>(sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x452,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 1) {
        bVar2 = checkPixels<float>(&local_1b8,&local_138,local_190.type,(int)local_1c8._data,
                                   local_190._4_4_,local_1c8._data._4_4_,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<float>(sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x44e,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      else if (pixelType == 0) {
        bVar2 = checkPixels<unsigned_int>
                          (&local_1b8,&local_118,local_190.type,(int)local_1c8._data,local_190._4_4_
                           ,local_1c8._data._4_4_,iVar6);
        if (!bVar2) {
          __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartFileMixingBasic.cpp"
                        ,0x44a,"void (anonymous namespace)::readFirstPart(const std::string &)");
        }
      }
      releasePixels(pixelType,&local_118,&local_138,&local_158,local_190.type,(int)local_1c8._data,
                    local_190._4_4_,local_1c8._data._4_4_);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                   *)&local_98);
      Imf_2_5::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)&local_1e0);
    }
  }
  if (local_1b8._data != (uint *)0x0) {
    operator_delete__(local_1b8._data);
  }
  if (local_158._data != (half **)0x0) {
    operator_delete__(local_158._data);
  }
  if (local_138._data != (float **)0x0) {
    operator_delete__(local_138._data);
  }
  if (local_118._data != (uint **)0x0) {
    operator_delete__(local_118._data);
  }
  if (local_f8._data != (half *)0x0) {
    operator_delete__(local_f8._data);
  }
  if (local_d8._data != (float *)0x0) {
    operator_delete__(local_d8._data);
  }
  if (local_b8._data != (uint *)0x0) {
    operator_delete__(local_b8._data);
  }
  return;
}

Assistant:

void
readFirstPart (const std::string & fn)
{
    Array2D<unsigned int> uData;
    Array2D<float> fData;
    Array2D<half> hData;
    
    Array2D<unsigned int*> deepUData;
    Array2D<float*> deepFData;
    Array2D<half*> deepHData;
    
    Array2D<unsigned int> sampleCount;
    
    cout << "Reading first part " << flush;
    int pixelType = pixelTypes[0];
    int partType = partTypes[0];
    int levelMode = levelModes[0];
    switch (partType)
    {
        case 0:
        {
            InputFile part (fn.c_str());

            int l1, l2;
            l1 = random_int(height);
            l2 = random_int(height);
            if (l1 > l2) swap(l1, l2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer(frameBuffer, pixelType,
                                uData, fData, hData, width, height);

            part.setFrameBuffer(frameBuffer);
            part.readPixels(l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert(checkPixels<float>(fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert(checkPixels<half>(hData, 0, width - 1, l1, l2, width));
                    break;
            }

            break;
        }
        case 1:
        {
            TiledInputFile part(fn.c_str());

            int tx1, tx2, ty1, ty2;
            int lx, ly;


            int numXLevels = part.numXLevels();
            int numYLevels = part.numYLevels();

            lx = random_int(numXLevels);
            ly = random_int(numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth(lx);
            int h = part.levelHeight(ly);

            int numXTiles = part.numXTiles(lx);
            int numYTiles = part.numYTiles(ly);
            tx1 = random_int(numXTiles);
            tx2 = random_int(numXTiles);
            ty1 = random_int(numYTiles);
            ty2 = random_int(numYTiles);
            if (tx1 > tx2) swap(tx1, tx2);
            if (ty1 > ty2) swap(ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer(frameBuffer, pixelType,
                                uData, fData, hData, w, h);

            part.setFrameBuffer(frameBuffer);
            part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
                case 1:
                    assert(checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
                case 2:
                    assert(checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                            w));
                    break;
            }

            break;
        }
        case 2:
        {
            DeepScanLineInputFile part (fn.c_str());

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase(height, width);
            frameBuffer.insertSampleCountSlice (Slice (OPENEXR_IMF_NAMESPACE::UINT,
                    (char *) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * width));

            setInputDeepFrameBuffer(frameBuffer, pixelType,
                                    deepUData, deepFData, deepHData, width, height);

            part.setFrameBuffer(frameBuffer);

            int l1, l2;
            l1 = random_int(height);
            l2 = random_int(height);
            if (l1 > l2) swap(l1, l2);

            part.readPixelSampleCounts(l1, l2);
            assert(checkSampleCount(sampleCount, 0, width - 1, l1, l2, width));

            allocatePixels(pixelType, sampleCount,
                           deepUData, deepFData, deepHData, 0, width - 1, l1, l2);

            part.readPixels(l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(sampleCount, deepUData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert(checkPixels<float>(sampleCount, deepFData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert(checkPixels<half>(sampleCount, deepHData, 0, width - 1, l1, l2, width));
                    break;
            }

            releasePixels(pixelType, deepUData, deepFData, deepHData, 0, width - 1, l1, l2);

            break;
        }
        case 3:
        {
            DeepTiledInputFile part (fn.c_str());
            int numXLevels = part.numXLevels();
            int numYLevels = part.numYLevels();

            int tx1, tx2, ty1, ty2;
            int lx, ly;
            lx = random_int(numXLevels);
            ly = random_int(numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth(lx);
            int h = part.levelHeight(ly);

            int numXTiles = part.numXTiles(lx);
            int numYTiles = part.numYTiles(ly);
            tx1 = random_int(numXTiles);
            tx2 = random_int(numXTiles);
            ty1 = random_int(numYTiles);
            ty2 = random_int(numYTiles);
            if (tx1 > tx2) swap(tx1, tx2);
            if (ty1 > ty2) swap(ty1, ty2);

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase(h, w);
            frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                    (char *) (&sampleCount[0][0]),
                    sizeof (unsigned int) * 1,
                    sizeof (unsigned int) * w));

            setInputDeepFrameBuffer(frameBuffer, pixelType,
                                    deepUData, deepFData, deepHData, w, h);

            part.setFrameBuffer(frameBuffer);

            part.readPixelSampleCounts(tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);
            assert(checkSampleCount(sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));

            allocatePixels(pixelType, sampleCount,
                           deepUData, deepFData, deepHData,
                           b1.min.x, b2.max.x, b1.min.y, b2.max.y);

            part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert(checkPixels<unsigned int>(sampleCount, deepUData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert(checkPixels<float>(sampleCount, deepFData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert(checkPixels<half>(sampleCount, deepHData,
                            b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }

            releasePixels(pixelType, deepUData, deepFData, deepHData,
                          b1.min.x, b2.max.x, b1.min.y, b2.max.y);

            break;
        }
    }
}